

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage8_avx2(__m256i *u,__m256i *cospim32,__m256i *cospi32,__m256i *cospim16,
                       __m256i *cospi48,__m256i *cospi16,__m256i *cospim48,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rnding,int bit)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i *palVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  auVar2 = vpmulld_avx2((undefined1  [32])u[10],(undefined1  [32])*cospim32);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0xd],(undefined1  [32])*cospi32);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar4 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpaddd_avx2((undefined1  [32])u[0xd],(undefined1  [32])u[10]);
  auVar2 = vpmulld_avx2(auVar2,(undefined1  [32])*cospi32);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  u[0xd] = alVar5;
  u[10] = alVar4;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0xb],(undefined1  [32])*cospim32);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0xc],(undefined1  [32])*cospi32);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar4 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpaddd_avx2((undefined1  [32])u[0xc],(undefined1  [32])u[0xb]);
  auVar2 = vpmulld_avx2(auVar2,(undefined1  [32])*cospi32);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  u[0xc] = alVar5;
  u[0xb] = alVar4;
  palVar9 = u + 0x10;
  for (uVar10 = 0x10; uVar10 != 0x14; uVar10 = uVar10 + 1) {
    auVar2 = vpaddd_avx2((undefined1  [32])u[uVar10 ^ 7],(undefined1  [32])*palVar9);
    auVar3 = vpsubd_avx2((undefined1  [32])*palVar9,(undefined1  [32])u[uVar10 ^ 7]);
    auVar2 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
    alVar4 = (__m256i)vpminsd_avx2(auVar2,(undefined1  [32])*clamp_hi);
    auVar2 = vpmaxsd_avx2(auVar3,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar2,(undefined1  [32])*clamp_hi);
    *palVar9 = alVar4;
    u[uVar10 ^ 7] = alVar5;
    auVar2 = vpaddd_avx2((undefined1  [32])u[uVar10 ^ 8],(undefined1  [32])u[uVar10 ^ 0xf]);
    auVar3 = vpsubd_avx2((undefined1  [32])u[uVar10 ^ 0xf],(undefined1  [32])u[uVar10 ^ 8]);
    auVar2 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
    alVar4 = (__m256i)vpminsd_avx2(auVar2,(undefined1  [32])*clamp_hi);
    auVar2 = vpmaxsd_avx2(auVar3,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar2,(undefined1  [32])*clamp_hi);
    u[uVar10 ^ 0xf] = alVar4;
    u[uVar10 ^ 8] = alVar5;
    palVar9 = palVar9 + 1;
  }
  alVar4 = *cospim16;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x24],(undefined1  [32])alVar4);
  alVar5 = *cospi48;
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x3b],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  alVar1 = *rnding;
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  alVar6 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x25],(undefined1  [32])alVar4);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x3a],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  alVar7 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x26],(undefined1  [32])alVar4);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x39],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar11 = ZEXT416((uint)bit);
  alVar8 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x27],(undefined1  [32])alVar4);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x38],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x27],(undefined1  [32])alVar5);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x38],(undefined1  [32])*cospi16);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])alVar1);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  u[0x38] = alVar5;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x26],(undefined1  [32])*cospi48);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x39],(undefined1  [32])*cospi16);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  u[0x39] = alVar5;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x25],(undefined1  [32])*cospi48);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x3a],(undefined1  [32])*cospi16);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  auVar11 = ZEXT416((uint)bit);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  u[0x3a] = alVar5;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x24],(undefined1  [32])*cospi48);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x3b],(undefined1  [32])*cospi16);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  u[0x3b] = alVar5;
  u[0x24] = alVar6;
  u[0x25] = alVar7;
  u[0x26] = alVar8;
  u[0x27] = alVar4;
  alVar4 = *cospim48;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x28],(undefined1  [32])alVar4);
  alVar5 = *cospim16;
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x37],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  alVar1 = *rnding;
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  alVar6 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x29],(undefined1  [32])alVar4);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x36],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  alVar7 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x2a],(undefined1  [32])alVar4);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x35],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  alVar8 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x2b],(undefined1  [32])alVar4);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x34],(undefined1  [32])alVar5);
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x2b],(undefined1  [32])alVar5);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x34],(undefined1  [32])*cospi48);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])alVar1);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  u[0x34] = alVar5;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x2a],(undefined1  [32])*cospim16);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x35],(undefined1  [32])*cospi48);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
  u[0x35] = alVar5;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x29],(undefined1  [32])*cospim16);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x36],(undefined1  [32])*cospi48);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  u[0x36] = alVar5;
  auVar2 = vpmulld_avx2((undefined1  [32])u[0x28],(undefined1  [32])*cospim16);
  auVar3 = vpmulld_avx2((undefined1  [32])u[0x37],(undefined1  [32])*cospi48);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar2 = vpaddd_avx2(auVar2,(undefined1  [32])*rnding);
  alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  u[0x37] = alVar5;
  u[0x28] = alVar6;
  u[0x29] = alVar7;
  u[0x2a] = alVar8;
  u[0x2b] = alVar4;
  return;
}

Assistant:

static inline void idct64_stage8_avx2(
    __m256i *u, const __m256i *cospim32, const __m256i *cospi32,
    const __m256i *cospim16, const __m256i *cospi48, const __m256i *cospi16,
    const __m256i *cospim48, const __m256i *clamp_lo, const __m256i *clamp_hi,
    const __m256i *rnding, int bit) {
  int i;
  __m256i temp1, temp2, temp3, temp4;
  temp1 = half_btf_avx2(cospim32, &u[10], cospi32, &u[13], rnding, bit);
  u[13] = half_btf_avx2(cospi32, &u[10], cospi32, &u[13], rnding, bit);
  u[10] = temp1;
  temp2 = half_btf_avx2(cospim32, &u[11], cospi32, &u[12], rnding, bit);
  u[12] = half_btf_avx2(cospi32, &u[11], cospi32, &u[12], rnding, bit);
  u[11] = temp2;

  for (i = 16; i < 20; ++i) {
    addsub_avx2(u[i], u[i ^ 7], &u[i], &u[i ^ 7], clamp_lo, clamp_hi);
    addsub_avx2(u[i ^ 15], u[i ^ 8], &u[i ^ 15], &u[i ^ 8], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_avx2(cospim16, &u[36], cospi48, &u[59], rnding, bit);
  temp2 = half_btf_avx2(cospim16, &u[37], cospi48, &u[58], rnding, bit);
  temp3 = half_btf_avx2(cospim16, &u[38], cospi48, &u[57], rnding, bit);
  temp4 = half_btf_avx2(cospim16, &u[39], cospi48, &u[56], rnding, bit);
  u[56] = half_btf_avx2(cospi48, &u[39], cospi16, &u[56], rnding, bit);
  u[57] = half_btf_avx2(cospi48, &u[38], cospi16, &u[57], rnding, bit);
  u[58] = half_btf_avx2(cospi48, &u[37], cospi16, &u[58], rnding, bit);
  u[59] = half_btf_avx2(cospi48, &u[36], cospi16, &u[59], rnding, bit);
  u[36] = temp1;
  u[37] = temp2;
  u[38] = temp3;
  u[39] = temp4;

  temp1 = half_btf_avx2(cospim48, &u[40], cospim16, &u[55], rnding, bit);
  temp2 = half_btf_avx2(cospim48, &u[41], cospim16, &u[54], rnding, bit);
  temp3 = half_btf_avx2(cospim48, &u[42], cospim16, &u[53], rnding, bit);
  temp4 = half_btf_avx2(cospim48, &u[43], cospim16, &u[52], rnding, bit);
  u[52] = half_btf_avx2(cospim16, &u[43], cospi48, &u[52], rnding, bit);
  u[53] = half_btf_avx2(cospim16, &u[42], cospi48, &u[53], rnding, bit);
  u[54] = half_btf_avx2(cospim16, &u[41], cospi48, &u[54], rnding, bit);
  u[55] = half_btf_avx2(cospim16, &u[40], cospi48, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;
}